

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O3

void __thiscall
trompeloeil::
list<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
::~list(list<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_trompeloeil::delete_disposer>
        *this)

{
  list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar1;
  list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *plVar2;
  
  (this->
  super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  )._vptr_list_elem = (_func_int **)&PTR__list_004f3bd0;
  plVar2 = (this->
           super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           ).next;
  if (plVar2 != &this->
                 super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
     ) {
    do {
      plVar1 = (list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                *)&plVar2->_vptr_list_elem;
      plVar2 = plVar2->next;
      (*plVar1->_vptr_list_elem[1])();
    } while (plVar2 != &this->
                        super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            );
    plVar2 = (this->
             super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
             ).next;
  }
  (this->
  super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  )._vptr_list_elem = (_func_int **)&PTR__list_elem_004f3c38;
  plVar1 = (this->
           super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           ).prev;
  plVar2->prev = plVar1;
  plVar1->next = plVar2;
  (this->
  super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ).next = &this->
            super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ;
  (this->
  super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ).prev = &this->
            super_list_elem<trompeloeil::condition_base<bool_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  ;
  return;
}

Assistant:

list<T, Disposer>::~list()
  {
    auto i = this->begin();
    while (i != this->end())
    {
      auto& elem = *i;
      ++i; // intrusive list, so advance before destroying
      Disposer::dispose(&elem);
    }
  }